

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

FrameOpResult __thiscall QRhiGles2::endOffscreenFrame(QRhiGles2 *this,EndFrameFlags flags)

{
  GLuint GVar1;
  int iVar2;
  int iVar3;
  Command *pCVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  quint64 nanoseconds;
  ulong uVar7;
  Command *__dest;
  long lVar8;
  FrameOpResult FVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 *local_48;
  undefined1 *apuStack_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ofr).active = false;
  GVar1 = (this->ofr).tsQueries[1];
  iVar2 = (this->ofr).cbWrapper.commands.p;
  iVar3 = (this->ofr).cbWrapper.commands.a;
  if (iVar2 == iVar3) {
    uVar7 = (long)iVar3 + 0x400;
    (this->ofr).cbWrapper.commands.a = (int)uVar7;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar7;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x68),8) == 0) {
      uVar7 = SUB168(auVar5 * ZEXT816(0x68),0);
    }
    __dest = (Command *)operator_new__(uVar7);
    pCVar4 = (this->ofr).cbWrapper.commands.v;
    if (pCVar4 != (Command *)0x0) {
      memcpy(__dest,pCVar4,(long)iVar2 * 0x68);
      operator_delete__(pCVar4);
    }
    (this->ofr).cbWrapper.commands.v = __dest;
  }
  pCVar4 = (this->ofr).cbWrapper.commands.v;
  iVar2 = (this->ofr).cbWrapper.commands.p;
  (this->ofr).cbWrapper.commands.p = iVar2 + 1;
  pCVar4[iVar2].cmd = EndFrame;
  pCVar4[iVar2].args.beginFrame.timestampQuery = GVar1;
  bVar6 = ensureContext(this,(QSurface *)0x0);
  if (bVar6) {
    executeCommandBuffer(this,&(this->ofr).cbWrapper.super_QRhiCommandBuffer);
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x13])();
    FVar9 = FrameOpSuccess;
    if ((this->ofr).tsQueries[0] != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      apuStack_40[0] = &DAT_aaaaaaaaaaaaaaaa;
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[1],0x8866,(quint64 *)apuStack_40);
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[0],0x8866,(quint64 *)&local_48);
      lVar8 = (long)apuStack_40[0] - (long)local_48;
      FVar9 = FrameOpSuccess;
      if (local_48 <= apuStack_40[0]) {
        auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar10._0_8_ = lVar8;
        auVar10._12_4_ = 0x45300000;
        (this->ofr).cbWrapper.lastGpuTime =
             ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / 1000000000.0;
      }
    }
  }
  else {
    FVar9 = (uint)this->contextLost * 2 + FrameOpError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return FVar9;
  }
  __stack_chk_fail();
}

Assistant:

QRhi::FrameOpResult QRhiGles2::endOffscreenFrame(QRhi::EndFrameFlags flags)
{
    Q_UNUSED(flags);
    Q_ASSERT(ofr.active);
    ofr.active = false;

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::EndFrame, ofr.tsQueries[1]);

    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    executeCommandBuffer(&ofr.cbWrapper);

    // Just as endFrame() does a flush when skipping the swapBuffers(), do it
    // here as well. This has the added benefit of playing nice when rendering
    // to a texture from a context and then consuming that texture from
    // another, sharing context.
    f->glFlush();

    if (ofr.tsQueries[0]) {
        quint64 timestamps[2];
        glGetQueryObjectui64v(ofr.tsQueries[1], GL_QUERY_RESULT, &timestamps[1]);
        glGetQueryObjectui64v(ofr.tsQueries[0], GL_QUERY_RESULT, &timestamps[0]);
        if (timestamps[1] >= timestamps[0]) {
            const quint64 nanoseconds = timestamps[1] - timestamps[0];
            ofr.cbWrapper.lastGpuTime = nanoseconds / 1000000000.0; // seconds
        }
    }

    return QRhi::FrameOpSuccess;
}